

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void ft::swap<int,ft::allocator<int>>
               (list<int,_ft::allocator<int>_> *x,list<int,_ft::allocator<int>_> *y)

{
  ostream *this;
  list<int,_ft::allocator<int>_> *y_local;
  list<int,_ft::allocator<int>_> *x_local;
  
  this = std::operator<<((ostream *)&std::cout,"list swap");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  list<int,_ft::allocator<int>_>::swap(x,y);
  return;
}

Assistant:

void swap(list<T, Alloc> & x, list<T, Alloc> & y) {
	std::cout << "list swap" << std::endl;
	x.swap(y);
}